

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

el_action_t ed_next_line(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t local_2c;
  wchar_t *pwStack_28;
  wchar_t nchars;
  wchar_t *ptr;
  wint_t c_local;
  EditLine *el_local;
  
  local_2c = c_hpos(el);
  pwStack_28 = (el->el_line).cursor;
  while ((pwStack_28 < (el->el_line).lastchar &&
         ((*pwStack_28 != L'\n' ||
          (wVar1 = (el->el_state).argument + L'\xffffffff', (el->el_state).argument = wVar1,
          L'\0' < wVar1))))) {
    pwStack_28 = pwStack_28 + 1;
  }
  if ((el->el_state).argument < L'\x01') {
    do {
      pwStack_28 = pwStack_28 + 1;
      bVar2 = false;
      if ((L'\0' < local_2c) && (bVar2 = false, pwStack_28 < (el->el_line).lastchar)) {
        bVar2 = *pwStack_28 != L'\n';
      }
      local_2c = local_2c + L'\xffffffff';
    } while (bVar2);
    (el->el_line).cursor = pwStack_28;
    el_local._7_1_ = '\x05';
  }
  else {
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_next_line(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *ptr;
	int nchars = c_hpos(el);

	/*
         * Move to the line requested
         */
	for (ptr = el->el_line.cursor; ptr < el->el_line.lastchar; ptr++)
		if (*ptr == '\n' && --el->el_state.argument <= 0)
			break;

	if (el->el_state.argument > 0)
		return CC_ERROR;

	/*
         * Move to the character requested
         */
	for (ptr++;
	    nchars-- > 0 && ptr < el->el_line.lastchar && *ptr != '\n';
	    ptr++)
		continue;

	el->el_line.cursor = ptr;
	return CC_CURSOR;
}